

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,std::shared_ptr<kratos::Var>>
::load_impl_sequence<0ul,1ul>
          (argument_loader<pybind11::detail::value_and_holder&,std::shared_ptr<kratos::Var>> *this,
          long call)

{
  undefined8 uVar1;
  handle src;
  bool bVar2;
  reference rVar3;
  
  uVar1 = **(undefined8 **)(call + 8);
  std::vector<bool,_std::allocator<bool>_>::operator[]
            ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  *(undefined8 *)(this + 0x28) = uVar1;
  src.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),1);
  bVar2 = type_caster_generic::
          load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                    ((type_caster_generic *)this,src,(*rVar3._M_p & rVar3._M_mask) != 0);
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }